

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btBroadphasePair>::quickSortInternal<btMultiSapBroadphasePairSortPredicate>
          (btAlignedObjectArray<btBroadphasePair> *this,
          btMultiSapBroadphasePairSortPredicate *CompareFunc,int lo,int hi)

{
  btBroadphasePair *pbVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int index0;
  long lVar7;
  btBroadphasePair local_58;
  
  pbVar1 = this->m_data;
  iVar4 = (hi + lo) / 2;
  local_58.m_pProxy0 = pbVar1[iVar4].m_pProxy0;
  local_58.m_pProxy1 = pbVar1[iVar4].m_pProxy1;
  local_58.m_algorithm = pbVar1[iVar4].m_algorithm;
  local_58.field_3 = pbVar1[iVar4].field_3;
  iVar4 = hi;
  index0 = lo;
  do {
    lVar6 = (long)index0 + -1;
    lVar5 = (long)index0 << 5;
    iVar2 = index0;
    do {
      index0 = iVar2;
      bVar3 = btMultiSapBroadphasePairSortPredicate::operator()
                        (CompareFunc,(btBroadphasePair *)((long)&this->m_data->m_pProxy0 + lVar5),
                         &local_58);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x20;
      iVar2 = index0 + 1;
    } while (bVar3);
    lVar5 = (long)iVar4 + 1;
    lVar7 = (long)iVar4 << 5;
    iVar2 = iVar4;
    do {
      iVar4 = iVar2;
      bVar3 = btMultiSapBroadphasePairSortPredicate::operator()
                        (CompareFunc,&local_58,
                         (btBroadphasePair *)((long)&this->m_data->m_pProxy0 + lVar7));
      lVar5 = lVar5 + -1;
      lVar7 = lVar7 + -0x20;
      iVar2 = iVar4 + -1;
    } while (bVar3);
    if (lVar6 <= lVar5) {
      swap(this,index0,iVar4);
      iVar4 = iVar4 + -1;
      index0 = index0 + 1;
    }
  } while (index0 <= iVar4);
  if (lo < iVar4) {
    quickSortInternal<btMultiSapBroadphasePairSortPredicate>(this,CompareFunc,lo,iVar4);
  }
  if (index0 < hi) {
    quickSortInternal<btMultiSapBroadphasePairSortPredicate>(this,CompareFunc,index0,hi);
  }
  return;
}

Assistant:

void quickSortInternal(const L& CompareFunc,int lo, int hi)
		{
		//  lo is the lower index, hi is the upper index
		//  of the region of array a that is to be sorted
			int i=lo, j=hi;
			T x=m_data[(lo+hi)/2];

			//  partition
			do
			{    
				while (CompareFunc(m_data[i],x)) 
					i++; 
				while (CompareFunc(x,m_data[j])) 
					j--;
				if (i<=j)
				{
					swap(i,j);
					i++; j--;
				}
			} while (i<=j);

			//  recursion
			if (lo<j) 
				quickSortInternal( CompareFunc, lo, j);
			if (i<hi) 
				quickSortInternal( CompareFunc, i, hi);
		}